

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O1

bool __thiscall
greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_computer::directed_flag_complex_computer_t_&>
::operator()(greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_computer::directed_flag_complex_computer_t_&>
             *this,filtration_index_t a,filtration_index_t b)

{
  tuple<unsigned_long,_unsigned_long,_int> local_58;
  tuple<unsigned_long,_unsigned_long,_int> local_40;
  
  if (b.super_pair<float,_int>.first < a.super_pair<float,_int>.first) {
    return true;
  }
  if (b.super_pair<float,_int>.first <= a.super_pair<float,_int>.first) {
    get_coboundary_size_and_gap_and_pivot
              (&local_40,this,(filtration_entry_t)a.super_pair<float,_int>);
    get_coboundary_size_and_gap_and_pivot
              (&local_58,this,(filtration_entry_t)b.super_pair<float,_int>);
    if (local_40.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>.
        super__Head_base<0UL,_unsigned_long,_false>._M_head_impl <
        local_58.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>.
        super__Head_base<0UL,_unsigned_long,_false>._M_head_impl) {
      return true;
    }
    if (local_40.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>.
        super__Head_base<0UL,_unsigned_long,_false>._M_head_impl <=
        local_58.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>.
        super__Head_base<0UL,_unsigned_long,_false>._M_head_impl) {
      if ((int)local_40.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>.
               super__Tuple_impl<1UL,_unsigned_long,_int>.super__Tuple_impl<2UL,_int>.
               super__Head_base<2UL,_int,_false>._M_head_impl <
          (int)local_58.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>.
               super__Tuple_impl<1UL,_unsigned_long,_int>.super__Tuple_impl<2UL,_int>.
               super__Head_base<2UL,_int,_false>._M_head_impl) {
        return true;
      }
      if ((int)local_40.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>.
               super__Tuple_impl<1UL,_unsigned_long,_int>.super__Tuple_impl<2UL,_int>.
               super__Head_base<2UL,_int,_false>._M_head_impl <=
          (int)local_58.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>.
               super__Tuple_impl<1UL,_unsigned_long,_int>.super__Tuple_impl<2UL,_int>.
               super__Head_base<2UL,_int,_false>._M_head_impl) {
        if (local_58.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>.
            super__Tuple_impl<1UL,_unsigned_long,_int>.super__Head_base<1UL,_unsigned_long,_false>.
            _M_head_impl <
            local_40.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>.
            super__Tuple_impl<1UL,_unsigned_long,_int>.super__Head_base<1UL,_unsigned_long,_false>.
            _M_head_impl) {
          return true;
        }
        return a.super_pair<float,_int>.second < b.super_pair<float,_int>.second &&
               local_58.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>.
               super__Tuple_impl<1UL,_unsigned_long,_int>.
               super__Head_base<1UL,_unsigned_long,_false>._M_head_impl <=
               local_40.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>.
               super__Tuple_impl<1UL,_unsigned_long,_int>.
               super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
      }
    }
  }
  return false;
}

Assistant:

bool operator()(Entry a, Entry b) const {
		// First order by the filtration value
		if (get_filtration(a) > get_filtration(b)) return true;
		if (get_filtration(a) < get_filtration(b)) return false;

		const auto& ta = get_coboundary_size_and_gap_and_pivot(a);
		const auto& tb = get_coboundary_size_and_gap_and_pivot(b);

		// Then the number of non-trivial coboundary entries
		if (std::get<0>(ta) < std::get<0>(tb)) return true;
		if (std::get<0>(ta) > std::get<0>(tb)) return false;

		// Then order by the better pivoting
		if (std::get<2>(ta) < std::get<2>(tb)) return true;
		if (std::get<2>(ta) > std::get<2>(tb)) return false;

		if (std::get<1>(ta) > std::get<1>(tb)) return true;
		if (std::get<1>(ta) < std::get<1>(tb)) return false;

		// Finally, order by their indices
		return get_index(a) < get_index(b);
	}